

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleString::deallocateInternalBuffer(SimpleString *this)

{
  long *in_RDI;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffe8;
  
  if (*in_RDI != 0) {
    deallocStringBuffer(unaff_retaddr,(size_t)in_RDI,(char *)in_RDI,in_stack_ffffffffffffffe8);
    *in_RDI = 0;
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

void SimpleString::deallocateInternalBuffer()
{
    if (buffer_) {
        deallocStringBuffer(buffer_, bufferSize_, __FILE__, __LINE__);
        buffer_ = NULLPTR;
        bufferSize_ = 0;
    }
}